

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallNormalHeapBucket.cpp
# Opt level: O1

void __thiscall
Memory::
SmallNormalHeapBucketBase<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>::
ScanInitialImplicitRoots
          (SmallNormalHeapBucketBase<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>
           *this,Recycler *recycler)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  HeapBlockList::
  ForEach<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>,Memory::SmallNormalHeapBucketBase<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>::ScanInitialImplicitRoots(Memory::Recycler*)::_lambda(Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>*)_1_>
            ((this->
             super_HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>)
             .fullBlockList,(SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0,
             (anon_class_8_1_b8cf05bd)recycler);
  HeapBlockList::
  ForEach<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>,Memory::SmallNormalHeapBucketBase<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>::ScanInitialImplicitRoots(Memory::Recycler*)::_lambda(Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>*)_2_>
            ((this->
             super_HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>)
             .heapBlockList,(SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0,
             (anon_class_8_1_b8cf05bd)recycler);
  if ((recycler->inPartialCollectMode == false) &&
     (this->partialHeapBlockList !=
      (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                       ,0x3e,"(recycler->inPartialCollectMode || partialHeapBlockList == nullptr)",
                       "recycler->inPartialCollectMode || partialHeapBlockList == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if (recycler->inPartialCollectMode == true) {
    HeapBlockList::
    ForEach<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>,Memory::SmallNormalHeapBucketBase<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>::ScanInitialImplicitRoots(Memory::Recycler*)::_lambda(Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>*)_3_>
              (this->partialHeapBlockList,
               (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0,
               (anon_class_8_1_b8cf05bd)recycler);
    HeapBlockList::
    ForEach<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>,Memory::SmallNormalHeapBucketBase<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>::ScanInitialImplicitRoots(Memory::Recycler*)::_lambda(Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>*)_4_>
              (this->partialSweptHeapBlockList,
               (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0,
               (anon_class_8_1_b8cf05bd)recycler);
    return;
  }
  return;
}

Assistant:

void
SmallNormalHeapBucketBase<TBlockType>::ScanInitialImplicitRoots(Recycler * recycler)
{
    HeapBlockList::ForEach(this->fullBlockList, [recycler](TBlockType * heapBlock)
    {
        heapBlock->ScanInitialImplicitRoots(recycler);
    });

#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
    if (CONFIG_FLAG_RELEASE(EnableConcurrentSweepAlloc) && !this->IsAnyFinalizableBucket())
    {
        HeapBlockList::ForEach(this->sweepableHeapBlockList, [recycler](TBlockType * heapBlock)
        {
            heapBlock->ScanInitialImplicitRoots(recycler);
        });
    }
#endif

    HeapBlockList::ForEach(this->heapBlockList, [recycler](TBlockType * heapBlock)
    {
        heapBlock->ScanInitialImplicitRoots(recycler);
    });

#if ENABLE_PARTIAL_GC
    Assert(recycler->inPartialCollectMode || partialHeapBlockList == nullptr);
    if (recycler->inPartialCollectMode)
    {
        HeapBlockList::ForEach(partialHeapBlockList, [recycler](TBlockType * heapBlock)
        {
            heapBlock->ScanInitialImplicitRoots(recycler);
        });
#if ENABLE_CONCURRENT_GC
        HeapBlockList::ForEach(partialSweptHeapBlockList, [recycler](TBlockType * heapBlock)
        {
            heapBlock->ScanInitialImplicitRoots(recycler);
        });
#endif
    }
#endif
}